

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void transform_test(png_modifier *pmIn,png_uint_32 idIn,image_transform *transform_listIn,char *name
                   )

{
  jmp_buf *pa_Var1;
  color_encoding *pcVar2;
  png_modifier *ppVar3;
  int iVar4;
  size_t sVar5;
  png_structp pp;
  undefined4 in_register_00000034;
  int in_R8D;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  png_infop pi;
  double local_728;
  double dStack_720;
  undefined1 local_718 [16];
  char full_name [256];
  transform_display local_600;
  jmp_buf exception__env;
  
  memset(&local_600,0,0x508);
  standard_display_init
            (&local_600.this,(png_store *)((ulong)pmIn & 0xffffffff),0,pm.use_update_info,in_R8D);
  pa_Var1 = pm.this.exception_context.penv;
  local_600.pm = &pm;
  local_600.max_gamma_8 = 0x10;
  local_600.output_colour_type = 0xff;
  local_600.output_bit_depth = 0xff;
  local_600.unpacked = '\0';
  pm.this.exception_context.penv = &exception__env;
  local_600.transform_list = (image_transform *)CONCAT44(in_register_00000034,idIn);
  iVar4 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
  if (iVar4 != 0) {
    pm.this.exception_context.caught = 1;
    pm.this.exception_context.penv = pa_Var1;
    modifier_reset((png_modifier *)pm.this.exception_context.v.etmp);
    return;
  }
  modifier_set_encoding(&pm);
  if ((pm.current_gamma != 0.0) || (NAN(pm.current_gamma))) {
    if ((pm.current_encoding != (color_encoding *)0x0) && (pm.current_encoding == pm.encodings)) {
      if (((pm.current_encoding)->gamma == pm.current_gamma) &&
         (!NAN((pm.current_encoding)->gamma) && !NAN(pm.current_gamma))) {
        srgb_modification_init(&local_600.srgb_mod,&pm,'\x03');
        goto LAB_0010d538;
      }
    }
    gama_modification_init(&local_600.gama_mod,&pm,pm.current_gamma);
    pcVar2 = pm.current_encoding;
    if (pm.current_encoding != (color_encoding *)0x0) {
      local_600.chrm_mod.encoding = pm.current_encoding;
      auVar6._0_8_ = ((pm.current_encoding)->blue).X +
                     ((pm.current_encoding)->green).X + ((pm.current_encoding)->red).X;
      auVar6._8_8_ = ((pm.current_encoding)->blue).Y +
                     ((pm.current_encoding)->green).Y + ((pm.current_encoding)->red).Y;
      dVar8 = auVar6._8_8_ + auVar6._0_8_ +
              ((pm.current_encoding)->red).Z + ((pm.current_encoding)->green).Z +
              ((pm.current_encoding)->blue).Z;
      auVar7._8_8_ = dVar8;
      auVar7._0_8_ = dVar8;
      auVar7 = divpd(auVar6,auVar7);
      local_728 = auVar7._0_8_ * 100000.0 + 0.5;
      dStack_720 = auVar7._8_8_ * 100000.0 + 0.5;
      dVar8 = floor(local_728);
      local_718._8_4_ = extraout_XMM0_Dc;
      local_718._0_8_ = dVar8;
      local_718._12_4_ = extraout_XMM0_Dd;
      dVar8 = floor(dStack_720);
      local_600.chrm_mod.wy = (int)dVar8;
      local_600.chrm_mod.wx = (int)(double)local_718._0_8_;
      dVar8 = (pcVar2->red).X;
      dVar8 = floor((dVar8 / ((pcVar2->red).Y + dVar8 + (pcVar2->red).Z)) * 100000.0 + 0.5);
      local_600.chrm_mod.rx = (png_fixed_point)dVar8;
      dVar8 = (pcVar2->red).Y;
      dVar8 = floor((dVar8 / ((pcVar2->red).X + dVar8 + (pcVar2->red).Z)) * 100000.0 + 0.5);
      local_600.chrm_mod.ry = (png_fixed_point)dVar8;
      dVar8 = (pcVar2->green).X;
      dVar8 = floor((dVar8 / ((pcVar2->green).Y + dVar8 + (pcVar2->green).Z)) * 100000.0 + 0.5);
      local_600.chrm_mod.gx = (png_fixed_point)dVar8;
      dVar8 = (pcVar2->green).Y;
      dVar8 = floor((dVar8 / ((pcVar2->green).X + dVar8 + (pcVar2->green).Z)) * 100000.0 + 0.5);
      local_600.chrm_mod.gy = (png_fixed_point)dVar8;
      dVar8 = (pcVar2->blue).X;
      dVar8 = floor((dVar8 / ((pcVar2->blue).Y + dVar8 + (pcVar2->blue).Z)) * 100000.0 + 0.5);
      local_600.chrm_mod.bx = (png_fixed_point)dVar8;
      dVar8 = (pcVar2->blue).Y;
      dVar8 = floor((dVar8 / ((pcVar2->blue).X + dVar8 + (pcVar2->blue).Z)) * 100000.0 + 0.5);
      local_600.chrm_mod.by = (png_fixed_point)dVar8;
      modification_init(&local_600.chrm_mod.this);
      local_600.chrm_mod.this.chunk = 0x6348524d;
      local_600.chrm_mod.this.modify_fn = chrm_modify;
      local_600.chrm_mod.this.add = 0x504c5445;
      local_600.chrm_mod.this.next = pm.modifications;
      pm.modifications = &local_600.chrm_mod.this;
    }
  }
LAB_0010d538:
  (*(local_600.transform_list)->ini)(local_600.transform_list,&local_600);
  sVar5 = safecat(full_name,0x100,0,(char *)transform_listIn);
  ppVar3 = local_600.pm;
  sVar5 = safecat_color_encoding
                    (full_name,sVar5,(size_t)(local_600.pm)->current_encoding,
                     (color_encoding *)transform_listIn,(local_600.pm)->current_gamma);
  if (ppVar3->encoding_ignored != 0) {
    safecat(full_name,0x100,sVar5,"[overridden]");
  }
  pp = set_modifier_for_read(local_600.pm,&pi,local_600.this.id,full_name);
  standard_palette_init(&local_600.this);
  if ((((local_600.pm)->this).field_0x18 & 0x40) == 0) {
    png_set_read_fn(pp,local_600.pm,modifier_read);
    png_read_info(pp,pi);
    transform_info_imp(&local_600,pp,pi);
    sequential_row(&local_600.this,pp,pi,-1,0);
    if (local_600.this.speed == 0) {
      transform_image_validate(&local_600,pp,pi);
    }
    else {
      (local_600.this.ps)->field_0x18 = (local_600.this.ps)->field_0x18 | 0x80;
    }
  }
  else {
    png_set_progressive_read_fn(pp,&local_600,transform_info,progressive_row,transform_end);
    modifier_progressive_read(local_600.pm,pp,pi);
  }
  modifier_reset(local_600.pm);
  pm.this.exception_context.caught = 0;
  pm.this.exception_context.penv = pa_Var1;
  return;
}

Assistant:

static void
transform_test(png_modifier *pmIn, png_uint_32 idIn,
    const image_transform* transform_listIn, const char * const name)
{
   transform_display d;
   context(&pmIn->this, fault);

   transform_display_init(&d, pmIn, idIn, transform_listIn);

   Try
   {
      size_t pos = 0;
      png_structp pp;
      png_infop pi;
      char full_name[256];

      /* Make sure the encoding fields are correct and enter the required
       * modifications.
       */
      transform_set_encoding(&d);

      /* Add any modifications required by the transform list. */
      d.transform_list->ini(d.transform_list, &d);

      /* Add the color space information, if any, to the name. */
      pos = safecat(full_name, sizeof full_name, pos, name);
      pos = safecat_current_encoding(full_name, sizeof full_name, pos, d.pm);

      /* Get a png_struct for reading the image. */
      pp = set_modifier_for_read(d.pm, &pi, d.this.id, full_name);
      standard_palette_init(&d.this);

#     if 0
         /* Logging (debugging only) */
         {
            char buffer[256];

            (void)store_message(&d.pm->this, pp, buffer, sizeof buffer, 0,
               "running test");

            fprintf(stderr, "%s\n", buffer);
         }
#     endif

      /* Introduce the correct read function. */
      if (d.pm->this.progressive)
      {
         /* Share the row function with the standard implementation. */
         png_set_progressive_read_fn(pp, &d, transform_info, progressive_row,
            transform_end);

         /* Now feed data into the reader until we reach the end: */
         modifier_progressive_read(d.pm, pp, pi);
      }
      else
      {
         /* modifier_read expects a png_modifier* */
         png_set_read_fn(pp, d.pm, modifier_read);

         /* Check the header values: */
         png_read_info(pp, pi);

         /* Process the 'info' requirements. Only one image is generated */
         transform_info_imp(&d, pp, pi);

         sequential_row(&d.this, pp, pi, -1, 0);

         if (!d.this.speed)
            transform_image_validate(&d, pp, pi);
         else
            d.this.ps->validated = 1;
      }

      modifier_reset(d.pm);
   }

   Catch(fault)
   {
      modifier_reset(voidcast(png_modifier*,(void*)fault));
   }
}